

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O0

RealType __thiscall OpenMD::RNEMD::SPFForceManager::getScaledDeltaU(SPFForceManager *this)

{
  double dVar1;
  uint uVar2;
  element_type *peVar3;
  long in_RDI;
  RealType lambda_00;
  RealType RVar4;
  RealType lambda;
  shared_ptr<OpenMD::SPFData> currentSPFData;
  Snapshot *in_stack_ffffffffffffff88;
  SPFData *in_stack_ffffffffffffff90;
  RealType in_stack_ffffffffffffff98;
  errorStruct *in_stack_ffffffffffffffa0;
  double local_8;
  
  Snapshot::getSPFData(in_stack_ffffffffffffff88);
  peVar3 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x3f2a73);
  dVar1 = peVar3->lambda;
  uVar2 = std::isinf(*(double *)(in_RDI + 0xd60));
  if (((((uVar2 & 1) != 0) || (uVar2 = std::isnan(*(double *)(in_RDI + 0xd60)), (uVar2 & 1) != 0))
      || (uVar2 = std::isinf(*(double *)(in_RDI + 0xd58)), (uVar2 & 1) != 0)) ||
     (uVar2 = std::isnan(*(double *)(in_RDI + 0xd58)), (uVar2 & 1) != 0)) {
    in_stack_ffffffffffffffa0 = &painCave;
    snprintf(painCave.errMsg,2000,
             "SPFForceManager detected a numerical error in the potential\n\tenergy with a lambda value of %f. Selecting a new molecule.\n"
             ,dVar1);
    *(int *)((long)&(((SPFForceManager *)in_stack_ffffffffffffffa0)->super_ForceManager).evaluator_.
                    indexFinder.selectionSets_.
                    super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                    _M_impl.super__Vector_impl_data + 8) = 0;
    *(int *)((long)&(((SPFForceManager *)in_stack_ffffffffffffffa0)->super_ForceManager).evaluator_.
                    indexFinder.selectionSets_.
                    super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                    _M_impl.super__Vector_impl_data + 0xc) = 2;
    simError();
    *(undefined1 *)(in_RDI + 0xd38) = 0;
    std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3f2b67);
    SPFData::clear(in_stack_ffffffffffffff90);
  }
  if (1e-06 <= dVar1) {
    lambda_00 = f_lambda((SPFForceManager *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    RVar4 = f_lambda((SPFForceManager *)in_stack_ffffffffffffffa0,lambda_00);
    local_8 = -(lambda_00 - RVar4) * (*(double *)(in_RDI + 0xd60) - *(double *)(in_RDI + 0xd58));
  }
  else {
    local_8 = 0.0;
  }
  std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x3f2c4a);
  return local_8;
}

Assistant:

RealType SPFForceManager::getScaledDeltaU() {
    std::shared_ptr<SPFData> currentSPFData = currentSnapshot_->getSPFData();

    RealType lambda = currentSPFData->lambda;

    // Some checking against unreasonable potentials
    if (std::isinf(potentialSink_) || std::isnan(potentialSink_) ||
        std::isinf(potentialSource_) || std::isnan(potentialSource_)) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SPFForceManager detected a numerical error in the potential\n"
          "\tenergy with a lambda value of %f. Selecting a new molecule.\n",
          lambda);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();

      hasSelectedMolecule_ = false;
      currentSPFData->clear();
    }

    if (lambda < 1e-6) { return 0.0; }

    return -(f_lambda(lambda) - f_lambda(lambda - deltaLambda_)) *
           (potentialSink_ - potentialSource_);
  }